

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

int x509_name_ex_i2d(ASN1_VALUE **val,uchar **out,ASN1_ITEM *it)

{
  X509_NAME *a;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  OPENSSL_STACK *sk;
  size_t sVar4;
  void *p_00;
  OPENSSL_STACK *sk_00;
  size_t sVar5;
  undefined4 extraout_var;
  uchar *p;
  OPENSSL_STACK *local_40;
  uchar *local_38;
  
  a = (X509_NAME *)*val;
  if (a->modified == 0) {
LAB_001a543f:
    uVar1 = a->bytes->length;
    iVar3 = (int)uVar1;
    if (out != (uchar **)0x0) {
      if ((uVar1 & 0xffffffff) != 0) {
        memcpy(*out,a->bytes->data,(long)iVar3);
      }
      *out = *out + iVar3;
    }
  }
  else {
    sk = OPENSSL_sk_new_null();
    if (sk != (OPENSSL_STACK *)0x0) {
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
      if (sVar4 != 0) {
        iVar3 = -1;
        sVar4 = 0;
        sk_00 = (OPENSSL_STACK *)0x0;
        do {
          p_00 = OPENSSL_sk_value((OPENSSL_STACK *)a->entries,sVar4);
          if (*(int *)((long)p_00 + 0x10) != iVar3) {
            sk_00 = OPENSSL_sk_new_null();
            if (sk_00 == (OPENSSL_STACK *)0x0) goto LAB_001a5473;
            sVar5 = OPENSSL_sk_push(sk,sk_00);
            if (sVar5 == 0) {
              OPENSSL_sk_free(sk_00);
              goto LAB_001a5473;
            }
            iVar3 = *(int *)((long)p_00 + 0x10);
          }
          sVar5 = OPENSSL_sk_push(sk_00,p_00);
          if (sVar5 == 0) goto LAB_001a5473;
          sVar4 = sVar4 + 1;
          sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
        } while (sVar4 < sVar5);
      }
      local_40 = sk;
      uVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&local_40,(uchar **)0x0,
                               (ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1,0);
      if ((0 < (int)uVar2) &&
         (iVar3 = BUF_MEM_grow((BUF_MEM *)a->bytes,(ulong)uVar2), CONCAT44(extraout_var,iVar3) != 0)
         ) {
        local_38 = (uchar *)a->bytes->data;
        iVar3 = ASN1_item_ex_i2d((ASN1_VALUE **)&local_40,&local_38,
                                 (ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1,0);
        if (0 < iVar3) {
          OPENSSL_sk_pop_free_ex
                    (sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,local_sk_X509_NAME_ENTRY_free);
          a->modified = 0;
          iVar3 = x509_name_canon(a);
          if (iVar3 == 0) {
            return -1;
          }
          goto LAB_001a543f;
        }
      }
    }
LAB_001a5473:
    OPENSSL_sk_pop_free_ex
              (sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,local_sk_X509_NAME_ENTRY_free);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int x509_name_ex_i2d(ASN1_VALUE **val, unsigned char **out,
                            const ASN1_ITEM *it) {
  X509_NAME *a = (X509_NAME *)*val;
  if (a->modified && (!x509_name_encode(a) || !x509_name_canon(a))) {
    return -1;
  }
  int ret = a->bytes->length;
  if (out != NULL) {
    OPENSSL_memcpy(*out, a->bytes->data, ret);
    *out += ret;
  }
  return ret;
}